

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * Curl_cache_addr(Curl_easy *data,Curl_addrinfo *addr,char *hostname,int port)

{
  CURLcode CVar1;
  undefined8 *p;
  size_t sVar2;
  CURLcode result;
  Curl_dns_entry *dns2;
  Curl_dns_entry *dns;
  size_t entry_len;
  char entry_id [262];
  int port_local;
  char *hostname_local;
  Curl_addrinfo *addr_local;
  Curl_easy *data_local;
  
  unique0x1000014c = port;
  hostname_local = (char *)addr;
  addr_local = (Curl_addrinfo *)data;
  if (((*(ulong *)&(data->set).field_0x9a0 >> 0x32 & 1) == 0) ||
     (CVar1 = Curl_shuffle_addr(data,(Curl_addrinfo **)&hostname_local), CVar1 == CURLE_OK)) {
    p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    if (p == (undefined8 *)0x0) {
      data_local = (Curl_easy *)0x0;
    }
    else {
      create_hostcache_id(hostname,stack0xffffffffffffffd4,(char *)&entry_len,0x106);
      sVar2 = strlen((char *)&entry_len);
      p[2] = 1;
      *p = hostname_local;
      time(p + 1);
      if (p[1] == 0) {
        p[1] = 1;
      }
      data_local = (Curl_easy *)
                   Curl_hash_add((Curl_hash *)addr_local[3].ai_canonname,&entry_len,sVar2 + 1,p);
      if (data_local == (Curl_easy *)0x0) {
        (*Curl_cfree)(p);
        data_local = (Curl_easy *)0x0;
      }
      else {
        data_local->prev = (Curl_easy *)((long)&data_local->prev->magic + 1);
      }
    }
  }
  else {
    data_local = (Curl_easy *)0x0;
  }
  return (Curl_dns_entry *)data_local;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct Curl_easy *data,
                struct Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result)
      return NULL;
  }
#endif

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  dns->inuse = 1;   /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates permanent CURLOPT_RESOLVE entry */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */
  return dns;
}